

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmNinjaTargetGenerator::EnsureParentDirectoryExists(cmNinjaTargetGenerator *this,string *path)

{
  string local_38;
  string *local_18;
  string *path_local;
  cmNinjaTargetGenerator *this_local;
  
  local_18 = path;
  path_local = (string *)this;
  cmsys::SystemTools::GetParentDirectory(&local_38,path);
  EnsureDirectoryExists(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void cmNinjaTargetGenerator::EnsureParentDirectoryExists(
  const std::string& path) const
{
  EnsureDirectoryExists(cmSystemTools::GetParentDirectory(path));
}